

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O1

size_t __thiscall
booster::aio::stream_socket::read_some(stream_socket *this,mutable_buffer *buffer,error_code *e)

{
  error_category *peVar1;
  ulong uVar2;
  int *piVar3;
  int in_ECX;
  
  uVar2 = readv(this,(int)buffer,(iovec *)e,in_ECX);
  peVar1 = aio_error_cat;
  if ((int)uVar2 < 0) {
    piVar3 = __errno_location();
    peVar1 = syscat;
    e->_M_value = *piVar3;
    e->_M_cat = peVar1;
  }
  else {
    if ((int)uVar2 != 0) {
      return uVar2 & 0xffffffff;
    }
    e->_M_value = 3;
    e->_M_cat = peVar1;
  }
  return 0;
}

Assistant:

size_t stream_socket::read_some(mutable_buffer const &buffer,system::error_code &e)
{
	int n=readv(buffer);
	if(n < 0) {
		e=geterror();
		return 0;
	}
	if(n == 0) {
		e=system::error_code(aio_error::eof,aio_error_cat);
		return 0;
	}
	return n;
}